

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jobs.cpp
# Opt level: O2

void __thiscall
JsUtil::BackgroundJobProcessor::AddManager(BackgroundJobProcessor *this,JobManager *manager)

{
  code *pcVar1;
  bool bVar2;
  CriticalSection *in_RAX;
  undefined4 *puVar3;
  uint i;
  ulong uVar4;
  AutoCriticalSection local_28;
  AutoCriticalSection lock;
  
  if (manager == (JobManager *)0x0) {
    AssertCount = AssertCount + 1;
    local_28.cs = in_RAX;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x315,"(manager)","manager");
    if (!bVar2) goto LAB_005f888c;
    *puVar3 = 0;
  }
  for (uVar4 = 0; uVar4 < this->threadCount; uVar4 = uVar4 + 1) {
    (*manager->_vptr_JobManager[4])
              (manager,&this->parallelThreadData[uVar4]->backgroundPageAllocator);
  }
  local_28.cs = &this->criticalSection;
  CCLock::Enter(&(local_28.cs)->super_CCLock);
  if ((this->super_JobProcessor).isClosed == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Common/Jobs.cpp"
                       ,0x31d,"(!IsClosed())","!IsClosed()");
    if (!bVar2) {
LAB_005f888c:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  JobProcessor::AddManager(&this->super_JobProcessor,manager);
  IndicateNewJob(this);
  AutoCriticalSection::~AutoCriticalSection(&local_28);
  return;
}

Assistant:

void BackgroundJobProcessor::AddManager(JobManager *const manager)
    {
        Assert(manager);

        IterateBackgroundThreads([&manager](ParallelThreadData *threadData){
            manager->ProcessorThreadSpecificCallBack(threadData->GetPageAllocator());
            return false;
        });

        AutoCriticalSection lock(&criticalSection);
        Assert(!IsClosed());

        JobProcessor::AddManager(manager);


        IndicateNewJob();
    }